

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O3

void Bmc_FxAddClauses(sat_solver *pSat,Vec_Int_t *vDivs,int iCiVarBeg,int iVarStart)

{
  uint uVar1;
  int *piVar2;
  sat_solver *psVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  undefined4 in_register_00000014;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  sat_solver *local_78;
  int local_70;
  uint local_6c;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  Vec_Int_t *local_50;
  uint local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  local_58 = CONCAT44(in_register_00000014,iCiVarBeg);
  uVar12 = vDivs->nSize;
  uVar4 = uVar12 + 3;
  if (-1 < (int)uVar12) {
    uVar4 = uVar12;
  }
  if ((uVar12 & 3) != 0) {
    __assert_fail("Vec_IntSize(vDivs) % 4 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFx.c"
                  ,0x28a,"void Bmc_FxAddClauses(sat_solver *, Vec_Int_t *, int, int)");
  }
  if (3 < (int)uVar12) {
    uVar4 = (int)uVar4 >> 2;
    local_70 = iCiVarBeg * 2;
    uVar13 = (uVar4 + iVarStart) * 2 - 1;
    local_38 = (ulong)uVar4 << 2;
    uVar15 = 0;
    uVar12 = uVar4 + iVarStart;
    uVar4 = (uVar4 + iVarStart) * 2;
    local_78 = pSat;
    local_50 = vDivs;
    do {
      iVar7 = local_70;
      psVar3 = local_78;
      uVar4 = uVar4 - 2;
      uVar12 = uVar12 - 1;
      if (((((long)vDivs->nSize <= (long)uVar15) ||
           (uVar9 = (ulong)(uint)vDivs->nSize, uVar9 <= uVar15 + 1)) || (uVar9 <= uVar15 + 2)) ||
         (uVar9 <= uVar15 + 3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = vDivs->pArray;
      iVar6 = piVar2[uVar15];
      uVar11 = piVar2[uVar15 + 1];
      uVar1 = piVar2[uVar15 + 2];
      iVar5 = (int)local_58;
      local_80 = uVar13;
      local_7c = uVar4;
      local_6c = uVar12;
      if (iVar6 == 3) {
        if (((int)uVar11 < 0) || ((int)uVar1 < 0)) {
LAB_00541802:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar13 = piVar2[uVar15 + 3];
        if ((int)uVar13 < 0) goto LAB_00541802;
        uVar8 = (uVar11 >> 1) + iVar5;
        local_40 = (ulong)(uVar1 >> 1);
        uVar10 = (uVar1 >> 1) + iVar5;
        uVar14 = iVar5 + (uVar13 >> 1);
        local_60 = (ulong)uVar14;
        local_68 = (ulong)uVar13;
        if ((int)(uVar8 | uVar12 | uVar10 | uVar14) < 0) {
          __assert_fail("iVarC >= 0 && iVarT >= 0 && iVarE >= 0 && iVarZ >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x19c,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
        local_44 = (uVar11 & 1) + uVar8 * 2;
        uVar11 = local_44 ^ 1;
        uVar12 = (uVar1 & 1) + uVar10 * 2;
        local_8c = uVar11;
        local_88 = uVar12 ^ 1;
        local_84 = uVar4;
        iVar7 = sat_solver_addclause(local_78,(lit *)&local_8c,(lit *)&local_80);
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x1a2,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
        local_84 = local_80;
        local_8c = uVar11;
        local_88 = uVar12;
        local_48 = uVar12;
        iVar7 = sat_solver_addclause(local_78,(lit *)&local_8c,(lit *)&local_80);
        uVar4 = local_44;
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x1a8,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
        local_8c = local_44;
        uVar11 = ((uint)local_68 & 1) + (int)local_60 * 2;
        local_84 = local_7c;
        local_88 = uVar11 ^ 1;
        iVar7 = sat_solver_addclause(local_78,(lit *)&local_8c,(lit *)&local_80);
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x1ae,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
        local_8c = uVar4;
        local_84 = local_80;
        local_88 = uVar11;
        iVar7 = sat_solver_addclause(local_78,(lit *)&local_8c,(lit *)&local_80);
        vDivs = local_50;
        psVar3 = local_78;
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x1b4,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
        pSat = local_78;
        if ((uint)local_40 != uVar13 >> 1) {
          local_8c = local_48;
          local_84 = local_80;
          local_88 = uVar11;
          iVar7 = sat_solver_addclause(local_78,(lit *)&local_8c,(lit *)&local_80);
          if (iVar7 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                          ,0x1bd,
                          "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                         );
          }
          local_84 = local_7c;
          local_8c = uVar12 ^ 1;
          local_88 = uVar11 ^ 1;
          iVar7 = sat_solver_addclause(psVar3,(lit *)&local_8c,(lit *)&local_80);
          pSat = local_78;
          if (iVar7 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                          ,0x1c3,
                          "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                         );
          }
        }
      }
      else if (iVar6 == 2) {
        if (((int)uVar11 < 0) || ((int)uVar1 < 0)) goto LAB_00541802;
        uVar4 = (uVar11 >> 1) + iVar5;
        uVar11 = (uVar1 >> 1) + iVar5;
        if ((int)(uVar4 | uVar12 | uVar11) < 0) {
          __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x17d,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_88 = uVar4 * 2 + 1;
        local_68 = CONCAT44(local_68._4_4_,local_88);
        local_84 = uVar11 * 2 + 1;
        local_60 = CONCAT44(local_60._4_4_,local_84);
        local_8c = uVar13;
        iVar7 = sat_solver_addclause(local_78,(lit *)&local_8c,(lit *)&local_80);
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x183,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_8c = uVar13;
        local_88 = uVar4 * 2;
        local_84 = uVar11 * 2;
        iVar7 = sat_solver_addclause(psVar3,(lit *)&local_8c,(lit *)&local_80);
        uVar12 = local_7c;
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x189,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_8c = local_7c;
        local_88 = (undefined4)local_68;
        local_84 = uVar11 * 2;
        iVar7 = sat_solver_addclause(psVar3,(lit *)&local_8c,(lit *)&local_80);
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,399,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_8c = uVar12;
        local_84 = (uint)local_60;
        local_88 = uVar4 * 2;
        iVar7 = sat_solver_addclause(psVar3,(lit *)&local_8c,(lit *)&local_80);
        vDivs = local_50;
        pSat = psVar3;
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x195,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
      }
      else {
        if (iVar6 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFx.c"
                        ,0x29e,"void Bmc_FxAddClauses(sat_solver *, Vec_Int_t *, int, int)");
        }
        if (((int)uVar11 < 0) || (local_68 = uVar15, (int)uVar1 < 0)) goto LAB_00541802;
        uVar11 = uVar11 + local_70;
        local_8c = uVar13;
        local_88 = uVar11;
        iVar6 = sat_solver_addclause(pSat,(lit *)&local_8c,(lit *)&local_84);
        if (iVar6 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x16b,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
        local_8c = uVar13;
        local_88 = uVar1 + iVar7;
        iVar6 = sat_solver_addclause(pSat,(lit *)&local_8c,(lit *)&local_84);
        if (iVar6 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x170,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
        local_8c = local_7c;
        local_88 = uVar11 ^ 1;
        local_84 = uVar1 + iVar7 ^ 1;
        iVar7 = sat_solver_addclause(pSat,(lit *)&local_8c,(lit *)&local_80);
        vDivs = local_50;
        uVar15 = local_68;
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x176,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
      }
      uVar15 = uVar15 + 4;
      uVar13 = local_80 - 2;
      uVar12 = local_6c;
      uVar4 = local_7c;
    } while (local_38 != uVar15);
  }
  return;
}

Assistant:

void Bmc_FxAddClauses( sat_solver * pSat, Vec_Int_t * vDivs, int iCiVarBeg, int iVarStart )
{
    int i, Func, pLits[3], nDivs = Vec_IntSize(vDivs)/4;
    assert( Vec_IntSize(vDivs) % 4 == 0 );
    // create new var for each divisor
    for ( i = 0; i < nDivs; i++ )
    {
        Func     = Vec_IntEntry(vDivs, 4*i+0);
        pLits[0] = Vec_IntEntry(vDivs, 4*i+1);
        pLits[1] = Vec_IntEntry(vDivs, 4*i+2);
        pLits[2] = Vec_IntEntry(vDivs, 4*i+3);
        //printf( "Adding clause with vars %d %d -> %d\n", iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), iVarStart + nDivs - 1 - i );
        if ( Func == DIV_AND )
            sat_solver_add_and( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), 
                Abc_LitIsCompl(pLits[0]), Abc_LitIsCompl(pLits[1]), 0 );
        else if ( Func == DIV_XOR )
            sat_solver_add_xor( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), 0 );
        else if ( Func == DIV_MUX )
            sat_solver_add_mux( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), iCiVarBeg + Abc_Lit2Var(pLits[2]), 
                Abc_LitIsCompl(pLits[0]), Abc_LitIsCompl(pLits[1]), Abc_LitIsCompl(pLits[2]), 0 );
        else assert( 0 );
    }
}